

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::weekNumber
          (Calendar *this,int32_t desiredDay,int32_t dayOfPeriod,int32_t dayOfWeek)

{
  byte bVar1;
  EDaysOfWeek EVar2;
  undefined4 local_24;
  undefined4 local_20;
  int32_t weekNo;
  int32_t periodStartDayOfWeek;
  int32_t dayOfWeek_local;
  int32_t dayOfPeriod_local;
  int32_t desiredDay_local;
  Calendar *this_local;
  
  EVar2 = getFirstDayOfWeek(this);
  local_20 = (int)(((dayOfWeek - EVar2) - dayOfPeriod) + 1) % 7;
  if (local_20 < 0) {
    local_20 = local_20 + 7;
  }
  local_24 = (desiredDay + local_20 + -1) / 7;
  bVar1 = getMinimalDaysInFirstWeek(this);
  if ((int)(uint)bVar1 <= 7 - local_20) {
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int32_t Calendar::weekNumber(int32_t desiredDay, int32_t dayOfPeriod, int32_t dayOfWeek)
{
    // Determine the day of the week of the first day of the period
    // in question (either a year or a month).  Zero represents the
    // first day of the week on this calendar.
    int32_t periodStartDayOfWeek = (dayOfWeek - getFirstDayOfWeek() - dayOfPeriod + 1) % 7;
    if (periodStartDayOfWeek < 0) periodStartDayOfWeek += 7;

    // Compute the week number.  Initially, ignore the first week, which
    // may be fractional (or may not be).  We add periodStartDayOfWeek in
    // order to fill out the first week, if it is fractional.
    int32_t weekNo = (desiredDay + periodStartDayOfWeek - 1)/7;

    // If the first week is long enough, then count it.  If
    // the minimal days in the first week is one, or if the period start
    // is zero, we always increment weekNo.
    if ((7 - periodStartDayOfWeek) >= getMinimalDaysInFirstWeek()) ++weekNo;

    return weekNo;
}